

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrCnf.c
# Opt level: O3

int Pdr_ObjSatVar2(Pdr_Man_t *p,int k,Aig_Obj_t *pObj,int Level,int Pol)

{
  Vec_Int_t *p_00;
  sat_solver *s;
  int **ppiVar1;
  Vec_Ptr_t *pVVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int *piVar7;
  Aig_Obj_t *pObj_00;
  uint *puVar8;
  long lVar9;
  int iVar10;
  size_t __size;
  Vec_Int_t *pVVar11;
  int Lit;
  int local_3c;
  sat_solver *local_38;
  
  if (p->pCnf2->pObj2Count[pObj->Id] < 0) {
    __assert_fail("p->pCnf2->pObj2Count[Aig_ObjId(pObj)] >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrCnf.c"
                  ,0xb0,"int Pdr_ObjSatVar2FindOrAdd(Pdr_Man_t *, int, Aig_Obj_t *, int *)");
  }
  pVVar11 = p->pvId2Vars + pObj->Id;
  iVar3 = pVVar11->nSize;
  if ((iVar3 == 0) && (iVar3 = 0, pVVar11->nCap <= k * 2)) {
    iVar3 = k * 2 + 1;
    __size = (long)iVar3 << 2;
    if (pVVar11->pArray == (int *)0x0) {
      piVar7 = (int *)malloc(__size);
    }
    else {
      piVar7 = (int *)realloc(pVVar11->pArray,__size);
    }
    pVVar11->pArray = piVar7;
    if (piVar7 == (int *)0x0) goto LAB_0090f1fc;
    pVVar11->nCap = iVar3;
    iVar3 = pVVar11->nSize;
  }
  if (iVar3 <= k) {
    iVar10 = k + 1;
    iVar4 = pVVar11->nCap;
    iVar6 = iVar4 * 2;
    if (k < iVar6) {
      if (iVar4 <= k) {
        if (pVVar11->pArray == (int *)0x0) {
          piVar7 = (int *)malloc((long)iVar4 << 3);
        }
        else {
          piVar7 = (int *)realloc(pVVar11->pArray,(long)iVar4 << 3);
        }
        pVVar11->pArray = piVar7;
joined_r0x0090f1f6:
        if (piVar7 == (int *)0x0) {
LAB_0090f1fc:
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
        }
        pVVar11->nCap = iVar6;
        iVar3 = pVVar11->nSize;
      }
    }
    else if (iVar4 <= k) {
      if (pVVar11->pArray == (int *)0x0) {
        piVar7 = (int *)malloc((long)iVar10 << 2);
      }
      else {
        piVar7 = (int *)realloc(pVVar11->pArray,(long)iVar10 << 2);
      }
      pVVar11->pArray = piVar7;
      iVar6 = iVar10;
      goto joined_r0x0090f1f6;
    }
    if (iVar3 <= k) {
      memset(pVVar11->pArray + iVar3,0,(ulong)(uint)(k - iVar3) * 4 + 4);
    }
    pVVar11->nSize = iVar10;
    iVar3 = iVar10;
  }
  if ((-1 < k) && (k < iVar3)) {
    iVar4 = pVVar11->pArray[(uint)k];
    if (iVar4 == 0) {
      if ((p->vSolvers->nSize <= k) || ((p->vVar2Ids).nSize <= k)) goto LAB_0090f278;
      p_00 = (Vec_Int_t *)(p->vVar2Ids).pArray[(uint)k];
      iVar3 = p_00->nSize;
      if (iVar3 < 1) {
        __assert_fail("iVarNew > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrCnf.c"
                      ,0xb8,"int Pdr_ObjSatVar2FindOrAdd(Pdr_Man_t *, int, Aig_Obj_t *, int *)");
      }
      s = (sat_solver *)p->vSolvers->pArray[(uint)k];
      Vec_IntPush(p_00,pObj->Id);
      if (pVVar11->nSize <= k) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      pVVar11->pArray[(uint)k] = iVar3;
      sat_solver_setnvars(s,iVar3 + 1);
      if (((k == 0) && ((*(uint *)&pObj->field_0x18 & 7) == 2)) &&
         (p->pAig->nTruePis <= (pObj->field_0).CioId)) {
        local_3c = iVar3 * 2 + 1;
        iVar3 = sat_solver_addclause(s,&local_3c,(lit *)&local_38);
        if (iVar3 != 1) {
          __assert_fail("RetValue == 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrCnf.c"
                        ,0xc0,"int Pdr_ObjSatVar2FindOrAdd(Pdr_Man_t *, int, Aig_Obj_t *, int *)");
        }
        if ((s->qtail != s->qhead) && (iVar3 = sat_solver_simplify(s), iVar3 == 0)) {
          __assert_fail("RetValue != 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.h"
                        ,0x102,"void sat_solver_compress(sat_solver *)");
        }
      }
      iVar3 = pVVar11->nSize;
    }
    if (k < iVar3) {
      iVar3 = pVVar11->pArray[(uint)k];
      if ((iVar4 == 0) && (((uint)*(undefined8 *)&pObj->field_0x18 & 7) != 2)) {
        iVar4 = p->pCnf2->pObj2Count[pObj->Id];
        if (iVar4 < 1) {
          __assert_fail("iClaBeg < iClaEnd",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrCnf.c"
                        ,0xd2,"int Pdr_ObjSatVar2(Pdr_Man_t *, int, Aig_Obj_t *, int, int)");
        }
        if (p->vSolvers->nSize <= k) {
LAB_0090f278:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        if ((Level < 0) || (p->vVLits->nSize <= Level)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                        ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
        }
        iVar6 = p->pCnf2->pObj2Clause[pObj->Id];
        iVar4 = iVar4 + iVar6;
        local_38 = (sat_solver *)p->vSolvers->pArray[(uint)k];
        pVVar11 = p->vVLits->pArray + (uint)Level;
        if (iVar4 < iVar6) {
          iVar4 = iVar6;
        }
        lVar9 = (long)iVar6;
        while (lVar9 != iVar4) {
          pVVar11->nSize = 0;
          uVar5 = *p->pCnf2->pClauses[lVar9];
          if ((int)uVar5 < 0) {
LAB_0090f21b:
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                          ,0x130,"int Abc_LitIsCompl(int)");
          }
          if (iVar3 < 0) {
LAB_0090f23a:
            __assert_fail("Var >= 0 && !(c >> 1)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                          ,0x12e,"int Abc_Var2Lit(int, int)");
          }
          Vec_IntPush(pVVar11,uVar5 & 1 | iVar3 * 2);
          ppiVar1 = p->pCnf2->pClauses;
          puVar8 = (uint *)(ppiVar1[lVar9] + 1);
          if (puVar8 < ppiVar1[lVar9 + 1]) {
            do {
              if ((int)*puVar8 < 0) {
                __assert_fail("Lit >= 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                              ,0x12f,"int Abc_Lit2Var(int)");
              }
              pVVar2 = p->pAig->vObjs;
              if (pVVar2 == (Vec_Ptr_t *)0x0) {
                pObj_00 = (Aig_Obj_t *)0x0;
              }
              else {
                uVar5 = *puVar8 >> 1;
                if (pVVar2->nSize <= (int)uVar5) goto LAB_0090f278;
                pObj_00 = (Aig_Obj_t *)pVVar2->pArray[uVar5];
              }
              iVar6 = Pdr_ObjSatVar2(p,k,pObj_00,Level + 1,Pol);
              if ((int)*puVar8 < 0) goto LAB_0090f21b;
              if (iVar6 < 0) goto LAB_0090f23a;
              Vec_IntPush(pVVar11,(*puVar8 & 1) + iVar6 * 2);
              puVar8 = puVar8 + 1;
            } while (puVar8 < p->pCnf2->pClauses[lVar9 + 1]);
          }
          iVar6 = sat_solver_addclause(local_38,pVVar11->pArray,pVVar11->pArray + pVVar11->nSize);
          lVar9 = lVar9 + 1;
          if (iVar6 == 0) {
            __assert_fail("RetValue",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrCnf.c"
                          ,0xdf,"int Pdr_ObjSatVar2(Pdr_Man_t *, int, Aig_Obj_t *, int, int)");
          }
        }
      }
      return iVar3;
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

int Pdr_ObjSatVar2( Pdr_Man_t * p, int k, Aig_Obj_t * pObj, int Level, int Pol )
{
    Vec_Int_t * vLits;
    sat_solver * pSat;
    int fNewVar = 0, iVarThis  = Pdr_ObjSatVar2FindOrAdd( p, k, pObj, &fNewVar );
    int * pLit, i, iVar, iClaBeg, iClaEnd, RetValue;
    if ( Aig_ObjIsCi(pObj) || !fNewVar )
        return iVarThis;
    iClaBeg = p->pCnf2->pObj2Clause[Aig_ObjId(pObj)];
    iClaEnd = iClaBeg + p->pCnf2->pObj2Count[Aig_ObjId(pObj)];
    assert( iClaBeg < iClaEnd );
    pSat = Pdr_ManSolver(p, k);
    vLits = Vec_WecEntry( p->vVLits, Level );
    for ( i = iClaBeg; i < iClaEnd; i++ )
    {
        Vec_IntClear( vLits );
        Vec_IntPush( vLits, Abc_Var2Lit( iVarThis, Abc_LitIsCompl(p->pCnf2->pClauses[i][0]) ) );
        for ( pLit = p->pCnf2->pClauses[i]+1; pLit < p->pCnf2->pClauses[i+1]; pLit++ )
        {
            iVar = Pdr_ObjSatVar2( p, k, Aig_ManObj(p->pAig, Abc_Lit2Var(*pLit)), Level+1, Pol );
            Vec_IntPush( vLits, Abc_Var2Lit( iVar, Abc_LitIsCompl(*pLit) ) );
        }
        RetValue = sat_solver_addclause( pSat, Vec_IntArray(vLits), Vec_IntArray(vLits)+Vec_IntSize(vLits) );
        assert( RetValue );
        (void) RetValue;
    }
    return iVarThis;
}